

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_game.cc
# Opt level: O2

void __thiscall
hanabi_learning_env::HanabiGame::HanabiGame
          (HanabiGame *this,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *params)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  uint __line;
  bool bVar1;
  int iVar2;
  AgentObservationType AVar3;
  int iVar4;
  int uid;
  int rank;
  char *__assertion;
  int iVar5;
  allocator local_13b9;
  string local_13b8 [156];
  
  this_00 = &this->params_;
  (this->chance_outcomes_).
  super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->chance_outcomes_).
  super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->moves_).
    super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->moves_).
  super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->moves_).
  super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->params_)._M_h._M_buckets = &(this->params_)._M_h._M_single_bucket;
  (this->params_)._M_h._M_bucket_count = 1;
  (this->params_)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->params_)._M_h._M_element_count = 0;
  (this->params_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->params_)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  this->num_colors_ = -1;
  this->num_ranks_ = -1;
  this->num_players_ = -1;
  this->hand_size_ = -1;
  this->max_information_tokens_ = -1;
  this->max_life_tokens_ = -1;
  this->cards_per_color_ = -1;
  this->seed_ = -1;
  this->random_start_player_ = false;
  this->observation_type_ = kCardKnowledge;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&this->rng_);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=(&this_00->_M_h,&params->_M_h);
  std::__cxx11::string::string((string *)local_13b8,"players",&local_13b9);
  iVar2 = ParameterValue<int>(this_00,local_13b8,2);
  this->num_players_ = iVar2;
  std::__cxx11::string::~string((string *)local_13b8);
  if (this->num_players_ - 6U < 0xfffffffc) {
    __assertion = "num_players_ >= MinPlayers() && num_players_ <= MaxPlayers()";
    __line = 0x21;
  }
  else {
    std::__cxx11::string::string((string *)local_13b8,"colors",&local_13b9);
    iVar2 = ParameterValue<int>(this_00,local_13b8,5);
    this->num_colors_ = iVar2;
    std::__cxx11::string::~string((string *)local_13b8);
    if (this->num_colors_ - 1U < 5) {
      std::__cxx11::string::string((string *)local_13b8,"ranks",&local_13b9);
      iVar2 = ParameterValue<int>(this_00,local_13b8,5);
      this->num_ranks_ = iVar2;
      std::__cxx11::string::~string((string *)local_13b8);
      if (this->num_ranks_ - 1U < 5) {
        std::__cxx11::string::string((string *)local_13b8,"hand_size",&local_13b9);
        iVar2 = ParameterValue<int>(this_00,local_13b8,this->num_players_ < 4 | 4);
        this->hand_size_ = iVar2;
        std::__cxx11::string::~string((string *)local_13b8);
        std::__cxx11::string::string((string *)local_13b8,"max_information_tokens",&local_13b9);
        iVar2 = ParameterValue<int>(this_00,local_13b8,8);
        this->max_information_tokens_ = iVar2;
        std::__cxx11::string::~string((string *)local_13b8);
        std::__cxx11::string::string((string *)local_13b8,"max_life_tokens",&local_13b9);
        iVar2 = ParameterValue<int>(this_00,local_13b8,3);
        this->max_life_tokens_ = iVar2;
        std::__cxx11::string::~string((string *)local_13b8);
        std::__cxx11::string::string((string *)local_13b8,"seed",&local_13b9);
        iVar2 = ParameterValue<int>(this_00,local_13b8,-1);
        this->seed_ = iVar2;
        std::__cxx11::string::~string((string *)local_13b8);
        std::__cxx11::string::string((string *)local_13b8,"random_start_player",&local_13b9);
        bVar1 = ParameterValue<bool>(this_00,local_13b8,false);
        this->random_start_player_ = bVar1;
        std::__cxx11::string::~string((string *)local_13b8);
        std::__cxx11::string::string((string *)local_13b8,"observation_type",&local_13b9);
        AVar3 = ParameterValue<int>(this_00,local_13b8,1);
        this->observation_type_ = AVar3;
        std::__cxx11::string::~string((string *)local_13b8);
        while ((long)this->seed_ == 0xffffffffffffffff) {
          std::random_device::random_device((random_device *)local_13b8);
          iVar2 = std::random_device::_M_getval();
          this->seed_ = iVar2;
          std::random_device::~random_device((random_device *)local_13b8);
        }
        std::
        mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
        ::seed(&this->rng_,(long)this->seed_);
        this->cards_per_color_ = 0;
        iVar2 = this->num_ranks_;
        iVar5 = 0;
        if (iVar2 < 1) {
          iVar2 = 0;
        }
        for (rank = 0; iVar2 != rank; rank = rank + 1) {
          iVar4 = NumberCardInstances(this,0,rank);
          iVar5 = iVar5 + iVar4;
          this->cards_per_color_ = iVar5;
        }
        if (this->num_players_ * this->hand_size_ <= iVar5 * this->num_colors_) {
          iVar2 = 0;
          while( true ) {
            iVar5 = MaxMoves(this);
            if (iVar5 <= iVar2) break;
            local_13b8[0]._M_dataplus._M_p = (pointer)ConstructMove(this,iVar2);
            std::
            vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
            ::emplace_back<hanabi_learning_env::HanabiMove>(&this->moves_,(HanabiMove *)local_13b8);
            iVar2 = iVar2 + 1;
          }
          for (iVar2 = 0; iVar2 < this->num_ranks_ * this->num_colors_; iVar2 = iVar2 + 1) {
            local_13b8[0]._M_dataplus._M_p = (pointer)ConstructChanceOutcome(this,iVar2);
            std::
            vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
            ::emplace_back<hanabi_learning_env::HanabiMove>
                      (&this->chance_outcomes_,(HanabiMove *)local_13b8);
          }
          return;
        }
        __assertion = "hand_size_ * num_players_ <= cards_per_color_ * num_colors_";
        __line = 0x3a;
      }
      else {
        __assertion = "num_ranks_ > 0 && num_ranks_ <= kMaxNumRanks";
        __line = 0x25;
      }
    }
    else {
      __assertion = "num_colors_ > 0 && num_colors_ <= kMaxNumColors";
      __line = 0x23;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/hanabi_lib/hanabi_game.cc"
                ,__line,
                "hanabi_learning_env::HanabiGame::HanabiGame(const std::unordered_map<std::string, std::string> &)"
               );
}

Assistant:

HanabiGame::HanabiGame(
    const std::unordered_map<std::string, std::string>& params) {
  params_ = params;
  num_players_ = ParameterValue<int>(params_, "players", kDefaultPlayers);
  REQUIRE(num_players_ >= MinPlayers() && num_players_ <= MaxPlayers());
  num_colors_ = ParameterValue<int>(params_, "colors", kMaxNumColors);
  REQUIRE(num_colors_ > 0 && num_colors_ <= kMaxNumColors);
  num_ranks_ = ParameterValue<int>(params_, "ranks", kMaxNumRanks);
  REQUIRE(num_ranks_ > 0 && num_ranks_ <= kMaxNumRanks);
  hand_size_ = ParameterValue<int>(params_, "hand_size", HandSizeFromRules());
  max_information_tokens_ = ParameterValue<int>(
      params_, "max_information_tokens", kInformationTokens);
  max_life_tokens_ =
      ParameterValue<int>(params_, "max_life_tokens", kLifeTokens);
  seed_ = ParameterValue<int>(params_, "seed", -1);
  random_start_player_ =
      ParameterValue<bool>(params_, "random_start_player", kDefaultRandomStart);
  observation_type_ = AgentObservationType(ParameterValue<int>(
      params_, "observation_type", AgentObservationType::kCardKnowledge));
  while (seed_ == -1) {
    seed_ = std::random_device()();
  }
  rng_.seed(seed_);

  // Work out number of cards per color, and check deck size is large enough.
  cards_per_color_ = 0;
  for (int rank = 0; rank < num_ranks_; ++rank) {
    cards_per_color_ += NumberCardInstances(0, rank);
  }
  REQUIRE(hand_size_ * num_players_ <= cards_per_color_ * num_colors_);

  // Build static list of moves.
  for (int uid = 0; uid < MaxMoves(); ++uid) {
    moves_.push_back(ConstructMove(uid));
  }
  for (int uid = 0; uid < MaxChanceOutcomes(); ++uid) {
    chance_outcomes_.push_back(ConstructChanceOutcome(uid));
  }
}